

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O0

void Gia_ManCheckUnateTest(Gia_Man_t *p,int fComputeAll,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  void *__ptr;
  abctime aVar6;
  int Res;
  char *pBuffer;
  uint local_30;
  int nNonUnate;
  int nUnate;
  int nVars;
  int o;
  int i;
  abctime clk;
  int fVerbose_local;
  int fComputeAll_local;
  Gia_Man_t *p_local;
  
  if (fComputeAll == 0) {
    aVar5 = Abc_Clock();
    iVar1 = Gia_ManCiNum(p);
    local_30 = 0;
    pBuffer._4_4_ = 0;
    __ptr = calloc((long)(iVar1 + 1),1);
    if (fVerbose != 0) {
      printf("Inputs  : ");
      for (nVars = 0; nVars < iVar1; nVars = nVars + 1) {
        printf("%d",(long)nVars % 10 & 0xffffffff);
      }
      printf("\n");
    }
    for (nUnate = 0; iVar2 = Gia_ManCoNum(p), nUnate < iVar2; nUnate = nUnate + 1) {
      for (nVars = 0; nVars < iVar1; nVars = nVars + 1) {
        iVar2 = Gia_ManCheckUnate(p,nVars,nUnate);
        if (iVar2 == 3) {
          *(undefined1 *)((long)__ptr + (long)nVars) = 0x20;
        }
        else if (iVar2 == 2) {
          *(undefined1 *)((long)__ptr + (long)nVars) = 0x70;
          local_30 = local_30 + 1;
        }
        else if (iVar2 == 1) {
          *(undefined1 *)((long)__ptr + (long)nVars) = 0x6e;
          local_30 = local_30 + 1;
        }
        else {
          if (iVar2 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUnate.c"
                          ,0xec,"void Gia_ManCheckUnateTest(Gia_Man_t *, int, int)");
          }
          *(undefined1 *)((long)__ptr + (long)nVars) = 0x2e;
          pBuffer._4_4_ = pBuffer._4_4_ + 1;
        }
      }
      if (fVerbose != 0) {
        printf("Out%4d : %s\n",(ulong)(uint)nUnate,__ptr);
      }
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    uVar3 = Gia_ManCiNum(p);
    uVar4 = Gia_ManCoNum(p);
    printf("Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",(ulong)uVar3,(ulong)uVar4,
           (ulong)(local_30 + pBuffer._4_4_),(ulong)local_30);
    Abc_Print(1,"%s =","Total time");
    aVar6 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
  }
  else {
    Gia_ManCheckUnateVecTest(p,fVerbose);
  }
  return;
}

Assistant:

void Gia_ManCheckUnateTest( Gia_Man_t * p, int fComputeAll, int fVerbose )
{
    if ( fComputeAll )
        Gia_ManCheckUnateVecTest( p, fVerbose );
    else
    {
        abctime clk = Abc_Clock();
        int i, o, nVars = Gia_ManCiNum(p);
        int nUnate = 0, nNonUnate = 0;
        char * pBuffer = ABC_CALLOC( char, nVars+1 );
        if ( fVerbose )
        {
            printf( "Inputs  : " );
            for ( i = 0; i < nVars; i++ )
                printf( "%d", i % 10 );
            printf( "\n" );
        }
        for ( o = 0; o < Gia_ManCoNum(p); o++ )
        {
            for ( i = 0; i < nVars; i++ )
            {
                int Res = Gia_ManCheckUnate( p, i, o );
                if ( Res == 3 )       pBuffer[i] = ' ';
                else if ( Res == 2 )  pBuffer[i] = 'p', nUnate++;
                else if ( Res == 1 )  pBuffer[i] = 'n', nUnate++;
                else if ( Res == 0 )  pBuffer[i] = '.', nNonUnate++;
                else assert( 0 );
            }
            if ( fVerbose )
                printf( "Out%4d : %s\n", o, pBuffer );
        }
        ABC_FREE( pBuffer );
        // print stats
        printf( "Ins/Outs = %4d/%4d.  Total supp = %5d.  Total unate = %5d.\n",
            Gia_ManCiNum(p), Gia_ManCoNum(p), nUnate+nNonUnate, nUnate );
        ABC_PRT( "Total time", Abc_Clock() - clk );
    }
}